

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref_test.c
# Opt level: O1

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  MppEncRefCfg ref;
  MppEncRefLtFrmCfg lt_ref [4];
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_14c;
  undefined8 uStack_144;
  undefined8 local_13c;
  undefined8 uStack_134;
  undefined8 local_12c;
  undefined8 local_124;
  undefined8 uStack_11c;
  undefined8 local_114;
  undefined8 uStack_10c;
  undefined8 local_104;
  undefined8 local_fc;
  undefined8 uStack_f4;
  undefined8 local_ec;
  undefined8 uStack_e4;
  undefined8 local_dc;
  undefined8 local_d4;
  undefined8 uStack_cc;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined4 local_b8;
  
  local_1d0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  memset(&local_168,0,0x140);
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test start\n",0);
  mpp_enc_ref_cfg_init(&local_1d0);
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test tsvc4 ref info generation start\n",0);
  mpp_enc_ref_cfg_set_cfg_cnt(local_1d0,1,9);
  local_1c8 = 0;
  uStack_1c0 = CONCAT44(uStack_1c0._4_4_,2);
  local_1b8 = 8;
  mpp_enc_ref_cfg_add_lt_cfg(local_1d0,1,&local_1c8);
  local_168 = 0;
  uStack_160 = 4;
  local_158 = 0x100000000;
  local_150 = 3;
  local_14c = 0;
  uStack_144 = 0;
  local_13c = 2;
  uStack_134 = 0;
  local_12c = 0x300000001;
  local_124 = 0;
  uStack_11c = 0;
  local_114 = 1;
  uStack_10c = 0;
  local_104 = 0x300000001;
  local_fc = 0;
  uStack_f4 = 0;
  local_ec = 2;
  uStack_e4 = 0;
  local_dc = 0x300000001;
  local_d4 = 0;
  uStack_cc = 0;
  local_c4 = 0;
  local_c0 = 4;
  local_b8 = 0;
  mpp_enc_ref_cfg_add_st_cfg(local_1d0,9,&local_168);
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test tsvc4 ref info verification start\n",0);
  uVar1 = mpp_enc_ref_cfg_check(local_1d0);
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test tsvc4 ref info verification ret %d\n",0,uVar1);
  mpp_enc_ref_cfg_show(local_1d0);
  iVar2 = mpp_enc_ref_cfg_reset(local_1d0);
  pcVar3 = "failed";
  if (iVar2 == 0) {
    pcVar3 = "success";
  }
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test %s\n",0,pcVar3);
  return iVar2;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    RK_S32 lt_cnt = 0;
    RK_S32 st_cnt = 0;
    MppEncRefCfg ref = NULL;
    MppEncRefLtFrmCfg lt_ref[4];
    MppEncRefStFrmCfg st_ref[16];

    memset(&lt_ref, 0, sizeof(lt_ref));
    memset(&st_ref, 0, sizeof(st_ref));

    mpp_log("mpp_enc_ref_test start\n");

    ret = mpp_enc_ref_cfg_init(&ref);

    mpp_log("mpp_enc_ref_test tsvc4 ref info generation start\n");

    lt_cnt = 1;
    st_cnt = 9;

    ret = mpp_enc_ref_cfg_set_cfg_cnt(ref, lt_cnt, st_cnt);

    /* set 8 frame lt-ref gap */
    lt_ref[0].lt_idx        = 0;
    lt_ref[0].temporal_id   = 0;
    lt_ref[0].ref_mode      = REF_TO_PREV_LT_REF;
    lt_ref[0].lt_gap        = 8;
    lt_ref[0].lt_delay      = 0;

    ret = mpp_enc_ref_cfg_add_lt_cfg(ref, 1, lt_ref);

    /* set tsvc4 st-ref struct */
    /* st 0 layer 0 - ref */
    st_ref[0].is_non_ref    = 0;
    st_ref[0].temporal_id   = 0;
    st_ref[0].ref_mode      = REF_TO_TEMPORAL_LAYER;
    st_ref[0].ref_arg       = 0;
    st_ref[0].repeat        = 0;
    /* st 1 layer 3 - non-ref */
    st_ref[1].is_non_ref    = 1;
    st_ref[1].temporal_id   = 3;
    st_ref[1].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[1].ref_arg       = 0;
    st_ref[1].repeat        = 0;
    /* st 2 layer 2 - ref */
    st_ref[2].is_non_ref    = 0;
    st_ref[2].temporal_id   = 2;
    st_ref[2].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[2].ref_arg       = 0;
    st_ref[2].repeat        = 0;
    /* st 3 layer 3 - non-ref */
    st_ref[3].is_non_ref    = 1;
    st_ref[3].temporal_id   = 3;
    st_ref[3].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[3].ref_arg       = 0;
    st_ref[3].repeat        = 0;
    /* st 4 layer 1 - ref */
    st_ref[4].is_non_ref    = 0;
    st_ref[4].temporal_id   = 1;
    st_ref[4].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[4].ref_arg       = 0;
    st_ref[4].repeat        = 0;
    /* st 5 layer 3 - non-ref */
    st_ref[5].is_non_ref    = 1;
    st_ref[5].temporal_id   = 3;
    st_ref[5].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[5].ref_arg       = 0;
    st_ref[5].repeat        = 0;
    /* st 6 layer 2 - ref */
    st_ref[6].is_non_ref    = 0;
    st_ref[6].temporal_id   = 2;
    st_ref[6].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[6].ref_arg       = 0;
    st_ref[6].repeat        = 0;
    /* st 7 layer 3 - non-ref */
    st_ref[7].is_non_ref    = 1;
    st_ref[7].temporal_id   = 3;
    st_ref[7].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[7].ref_arg       = 0;
    st_ref[7].repeat        = 0;
    /* st 8 layer 0 - ref */
    st_ref[8].is_non_ref    = 0;
    st_ref[8].temporal_id   = 0;
    st_ref[8].ref_mode      = REF_TO_TEMPORAL_LAYER;
    st_ref[8].ref_arg       = 0;
    st_ref[8].repeat        = 0;

    ret = mpp_enc_ref_cfg_add_st_cfg(ref, 9, st_ref);

    /* check and get dpb size */
    mpp_log("mpp_enc_ref_test tsvc4 ref info verification start\n");
    ret = mpp_enc_ref_cfg_check(ref);
    mpp_log("mpp_enc_ref_test tsvc4 ref info verification ret %d\n", ret);

    ret = mpp_enc_ref_cfg_show(ref);

    /* reset for next config */
    ret = mpp_enc_ref_cfg_reset(ref);

#if 0
    mpp_log("mpp_enc_ref_test smartp ref info generation start\n");

    /* typical smartp config */
    lt_cnt = 1;
    st_cnt = 3;

    ret = mpp_enc_ref_cfg_set_cfg_cnt(ref, lt_cnt, st_cnt);

    memset(&lt_ref, 0, sizeof(lt_ref));
    memset(&st_ref, 0, sizeof(st_ref));

    /* set 300 frame lt-ref gap */
    lt_ref[0].lt_idx        = 0;
    lt_ref[0].temporal_id   = 0;
    lt_ref[0].ref_mode      = REF_TO_PREV_INTRA;
    lt_ref[0].lt_gap        = 300;
    lt_ref[0].lt_delay      = 0;

    ret = mpp_enc_ref_cfg_add_lt_cfg(ref, 1, lt_ref);

    st_ref[0].is_non_ref    = 0;
    st_ref[0].temporal_id   = 0;
    st_ref[0].ref_mode      = REF_TO_PREV_LT_REF;
    st_ref[0].ref_arg       = 0;
    st_ref[0].repeat        = 0;

    st_ref[1].is_non_ref    = 0;
    st_ref[1].temporal_id   = 0;
    st_ref[1].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[1].ref_arg       = 0;
    st_ref[1].repeat        = 299;

    st_ref[2].is_non_ref    = 0;
    st_ref[2].temporal_id   = 0;
    st_ref[2].ref_mode      = REF_TO_PREV_LT_REF;
    st_ref[2].ref_arg       = 0;
    st_ref[2].repeat        = 0;

    ret = mpp_enc_ref_cfg_add_st_cfg(ref, 3, st_ref);

    mpp_log("mpp_enc_ref_test smartp ref info verification start\n");
    ret = mpp_enc_ref_cfg_check(ref);
    mpp_log("mpp_enc_ref_test smartp ref info verification ret %d\n", ret);

    ret = mpp_enc_ref_cfg_deinit(&ref);
#endif

    mpp_log("mpp_enc_ref_test %s\n", ret ? "failed" : "success");

    return ret;
}